

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O3

void printf_btr_c_can(can_bittiming *bt,_Bool hdr)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%13s","BTR BRPEXT");
    return;
  }
  uVar1 = bt->brp - 1;
  printf("0x%04x 0x%04x",
         (ulong)(bt->phase_seg2 * 0x1000 + 0x7000 & 0x7000 |
                (bt->phase_seg1 + bt->prop_seg) * 0x100 + 0xf00 & 0xf00 |
                bt->sjw * 0x40 + 0xc0 & 0xff | uVar1 & 0x3f),(ulong)(uVar1 >> 6 & 0xf));
  return;
}

Assistant:

static void printf_btr_c_can(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%13s", "BTR BRPEXT");
	} else {
		uint32_t btr;
		uint32_t brpext;

		btr = (((bt->brp -1) & 0x3f) << 0) |
			(((bt->sjw -1) & 0x3) << 6) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xf) << 8) |
			(((bt->phase_seg2 -1) & 0x7) << 12);
		brpext = ((bt->brp -1) >> 6) & 0xf;

		printf("0x%04x 0x%04x", btr, brpext);
	}
}